

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O3

bool __thiscall iutest::detail::SocketWriter::SendLn(SocketWriter *this,string *message)

{
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_38;
  undefined8 local_30;
  long local_28 [2];
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  iVar2 = (*(this->super_IOutStream)._vptr_IOutStream[2])(this,local_38,local_30,1);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool SendLn(const ::std::string& message)
    {
#ifdef IUTEST_OS_WINDOWS
        return Send(message + "\r\n");
#else
        return Send(message + "\r\n");
        //return Send(message + "\n");
#endif
    }